

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableLoadSettings(ImGuiTable *table)

{
  uint uVar1;
  char *pcVar2;
  ImGuiTableColumn *pIVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ImGuiContext *pIVar27;
  ImGuiID *pIVar28;
  ImGuiTableColumnIdx *pIVar29;
  byte bVar30;
  ImGuiContext *g;
  ulong uVar31;
  long lVar32;
  char cVar33;
  long lVar34;
  ulong uVar35;
  byte *pbVar36;
  int iVar37;
  bool bVar38;
  uint uVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar51;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar72;
  undefined1 auVar70 [16];
  int iVar73;
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar87;
  int iVar91;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  long lVar53;
  
  pIVar27 = GImGui;
  table->IsSettingsRequestLoad = false;
  if ((table->Flags & 0x10) == 0) {
    lVar34 = (long)table->SettingsOffset;
    if (lVar34 == -1) {
      pcVar2 = (pIVar27->SettingsTables).Buf.Data;
      if (pcVar2 != (char *)0x0) {
        pIVar28 = (ImGuiID *)(pcVar2 + 4);
        do {
          if (*pIVar28 == table->ID) {
            if (table->ColumnsCount != (int)(char)pIVar28[3]) {
              table->IsSettingsDirty = true;
            }
            table->SettingsOffset = (int)pIVar28 - (int)pcVar2;
            goto LAB_00150017;
          }
          pIVar28 = (ImGuiID *)((long)pIVar28 + (long)(int)pIVar28[-1]);
        } while (pIVar28 !=
                 (ImGuiID *)((long)(pIVar27->SettingsTables).Buf.Size + (long)(pcVar2 + 4)));
      }
    }
    else {
      pcVar2 = (pIVar27->SettingsTables).Buf.Data;
      pIVar28 = (ImGuiID *)(pcVar2 + lVar34);
      if ((int)pcVar2[lVar34 + 0xd] < table->ColumnsCount) {
        *pIVar28 = 0;
        pIVar28 = (ImGuiID *)0x0;
      }
LAB_00150017:
      table->SettingsLoadedFlags = pIVar28[1];
      table->RefScale = (float)pIVar28[2];
      uVar31 = (ulong)(char)(byte)pIVar28[3];
      if ((long)uVar31 < 1) {
        uVar31 = ~(-1L << ((byte)pIVar28[3] & 0x3f));
        uVar35 = 0;
      }
      else {
        pbVar36 = (byte *)((long)pIVar28 + 0x1b);
        iVar37 = 0;
        uVar35 = 0;
        do {
          uVar39 = (uint)(char)pbVar36[-3];
          uVar40 = (ulong)uVar39;
          if ((-1 < (int)uVar39) && ((int)uVar39 < table->ColumnsCount)) {
            pIVar3 = (table->Columns).Data;
            uVar1 = pIVar28[1];
            if ((uVar1 & 1) != 0) {
              *(undefined4 *)((long)&pIVar3[(int)uVar39].WidthRequest + (ulong)(*pbVar36 & 8)) =
                   *(undefined4 *)(pbVar36 + -0xb);
              pIVar3[(int)uVar39].AutoFitQueue = '\0';
            }
            if ((uVar1 & 2) != 0) {
              uVar40 = (ulong)pbVar36[-2];
            }
            pIVar3[(int)uVar39].DisplayOrder = (ImGuiTableColumnIdx)uVar40;
            uVar35 = uVar35 | 1L << (uVar40 & 0x3f);
            bVar38 = (bool)(*pbVar36 >> 2 & 1);
            pIVar3[(int)uVar39].IsUserEnabledNextFrame = bVar38;
            pIVar3[(int)uVar39].IsUserEnabled = bVar38;
            pIVar3[(int)uVar39].SortOrder = pbVar36[-1];
            pIVar3[(int)uVar39].field_0x65 = pIVar3[(int)uVar39].field_0x65 & 0xfc | *pbVar36 & 3;
            uVar31 = (ulong)(byte)pIVar28[3];
          }
          iVar37 = iVar37 + 1;
          bVar30 = (byte)uVar31;
          pbVar36 = pbVar36 + 0xc;
        } while (iVar37 < (char)bVar30);
        uVar31 = ~(-1L << (bVar30 & 0x3f));
        if (bVar30 == 0x40) {
          uVar31 = 0xffffffffffffffff;
        }
      }
      auVar26 = _DAT_0017a2b0;
      uVar39 = table->ColumnsCount;
      if (uVar35 == uVar31) {
        if ((int)uVar39 < 1) {
          return;
        }
      }
      else {
        if ((int)uVar39 < 1) {
          return;
        }
        lVar34 = (ulong)uVar39 - 1;
        auVar41._8_4_ = (int)lVar34;
        auVar41._0_8_ = lVar34;
        auVar41._12_4_ = (int)((ulong)lVar34 >> 0x20);
        pIVar29 = &((table->Columns).Data)->DisplayOrder;
        uVar31 = 0;
        auVar42 = auVar41;
        auVar52 = _DAT_00184220;
        auVar54 = _DAT_00184230;
        auVar55 = _DAT_00184240;
        auVar56 = _DAT_00184250;
        auVar57 = _DAT_00184260;
        auVar58 = _DAT_00184270;
        auVar59 = _DAT_00184280;
        auVar60 = _DAT_0017d7a0;
        do {
          auVar70 = auVar41 ^ auVar26;
          auVar74 = auVar60 ^ auVar26;
          iVar37 = auVar70._0_4_;
          iVar87 = -(uint)(iVar37 < auVar74._0_4_);
          iVar51 = auVar70._4_4_;
          auVar76._4_4_ = -(uint)(iVar51 < auVar74._4_4_);
          iVar72 = auVar70._8_4_;
          iVar91 = -(uint)(iVar72 < auVar74._8_4_);
          iVar73 = auVar70._12_4_;
          auVar76._12_4_ = -(uint)(iVar73 < auVar74._12_4_);
          auVar70._4_4_ = iVar87;
          auVar70._0_4_ = iVar87;
          auVar70._8_4_ = iVar91;
          auVar70._12_4_ = iVar91;
          auVar70 = pshuflw(auVar42,auVar70,0xe8);
          auVar75._4_4_ = -(uint)(auVar74._4_4_ == iVar51);
          auVar75._12_4_ = -(uint)(auVar74._12_4_ == iVar73);
          auVar75._0_4_ = auVar75._4_4_;
          auVar75._8_4_ = auVar75._12_4_;
          auVar61 = pshuflw(in_XMM11,auVar75,0xe8);
          auVar76._0_4_ = auVar76._4_4_;
          auVar76._8_4_ = auVar76._12_4_;
          auVar74 = pshuflw(auVar70,auVar76,0xe8);
          auVar42._8_4_ = 0xffffffff;
          auVar42._0_8_ = 0xffffffffffffffff;
          auVar42._12_4_ = 0xffffffff;
          auVar42 = (auVar74 | auVar61 & auVar70) ^ auVar42;
          auVar42 = packssdw(auVar42,auVar42);
          cVar33 = (char)uVar31;
          if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *pIVar29 = cVar33;
          }
          auVar61._4_4_ = iVar87;
          auVar61._0_4_ = iVar87;
          auVar61._8_4_ = iVar91;
          auVar61._12_4_ = iVar91;
          auVar76 = auVar75 & auVar61 | auVar76;
          auVar42 = packssdw(auVar76,auVar76);
          auVar74._8_4_ = 0xffffffff;
          auVar74._0_8_ = 0xffffffffffffffff;
          auVar74._12_4_ = 0xffffffff;
          auVar42 = packssdw(auVar42 ^ auVar74,auVar42 ^ auVar74);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42._0_4_ >> 8 & 1) != 0) {
            pIVar29[0x68] = cVar33 + '\x01';
          }
          auVar42 = auVar59 ^ auVar26;
          auVar62._0_4_ = -(uint)(iVar37 < auVar42._0_4_);
          auVar62._4_4_ = -(uint)(iVar51 < auVar42._4_4_);
          auVar62._8_4_ = -(uint)(iVar72 < auVar42._8_4_);
          auVar62._12_4_ = -(uint)(iVar73 < auVar42._12_4_);
          auVar77._4_4_ = auVar62._0_4_;
          auVar77._0_4_ = auVar62._0_4_;
          auVar77._8_4_ = auVar62._8_4_;
          auVar77._12_4_ = auVar62._8_4_;
          iVar87 = -(uint)(auVar42._4_4_ == iVar51);
          iVar91 = -(uint)(auVar42._12_4_ == iVar73);
          auVar13._4_4_ = iVar87;
          auVar13._0_4_ = iVar87;
          auVar13._8_4_ = iVar91;
          auVar13._12_4_ = iVar91;
          auVar88._4_4_ = auVar62._4_4_;
          auVar88._0_4_ = auVar62._4_4_;
          auVar88._8_4_ = auVar62._12_4_;
          auVar88._12_4_ = auVar62._12_4_;
          auVar42 = auVar13 & auVar77 | auVar88;
          auVar42 = packssdw(auVar42,auVar42);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar42 = packssdw(auVar42 ^ auVar4,auVar42 ^ auVar4);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42._0_4_ >> 0x10 & 1) != 0) {
            pIVar29[0xd0] = cVar33 + '\x02';
          }
          auVar42 = pshufhw(auVar42,auVar77,0x84);
          auVar14._4_4_ = iVar87;
          auVar14._0_4_ = iVar87;
          auVar14._8_4_ = iVar91;
          auVar14._12_4_ = iVar91;
          auVar74 = pshufhw(auVar62,auVar14,0x84);
          auVar70 = pshufhw(auVar42,auVar88,0x84);
          auVar43._8_4_ = 0xffffffff;
          auVar43._0_8_ = 0xffffffffffffffff;
          auVar43._12_4_ = 0xffffffff;
          auVar43 = (auVar70 | auVar74 & auVar42) ^ auVar43;
          auVar42 = packssdw(auVar43,auVar43);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42._0_4_ >> 0x18 & 1) != 0) {
            pIVar29[0x138] = cVar33 + '\x03';
          }
          auVar42 = auVar58 ^ auVar26;
          auVar63._0_4_ = -(uint)(iVar37 < auVar42._0_4_);
          auVar63._4_4_ = -(uint)(iVar51 < auVar42._4_4_);
          auVar63._8_4_ = -(uint)(iVar72 < auVar42._8_4_);
          auVar63._12_4_ = -(uint)(iVar73 < auVar42._12_4_);
          auVar15._4_4_ = auVar63._0_4_;
          auVar15._0_4_ = auVar63._0_4_;
          auVar15._8_4_ = auVar63._8_4_;
          auVar15._12_4_ = auVar63._8_4_;
          auVar74 = pshuflw(auVar88,auVar15,0xe8);
          auVar44._0_4_ = -(uint)(auVar42._0_4_ == iVar37);
          auVar44._4_4_ = -(uint)(auVar42._4_4_ == iVar51);
          auVar44._8_4_ = -(uint)(auVar42._8_4_ == iVar72);
          auVar44._12_4_ = -(uint)(auVar42._12_4_ == iVar73);
          auVar78._4_4_ = auVar44._4_4_;
          auVar78._0_4_ = auVar44._4_4_;
          auVar78._8_4_ = auVar44._12_4_;
          auVar78._12_4_ = auVar44._12_4_;
          auVar42 = pshuflw(auVar44,auVar78,0xe8);
          auVar79._4_4_ = auVar63._4_4_;
          auVar79._0_4_ = auVar63._4_4_;
          auVar79._8_4_ = auVar63._12_4_;
          auVar79._12_4_ = auVar63._12_4_;
          auVar70 = pshuflw(auVar63,auVar79,0xe8);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar42 = packssdw(auVar42 & auVar74,(auVar70 | auVar42 & auVar74) ^ auVar5);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pIVar29[0x1a0] = cVar33 + '\x04';
          }
          auVar16._4_4_ = auVar63._0_4_;
          auVar16._0_4_ = auVar63._0_4_;
          auVar16._8_4_ = auVar63._8_4_;
          auVar16._12_4_ = auVar63._8_4_;
          auVar79 = auVar78 & auVar16 | auVar79;
          auVar70 = packssdw(auVar79,auVar79);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar42 = packssdw(auVar42,auVar70 ^ auVar6);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42._4_2_ >> 8 & 1) != 0) {
            pIVar29[0x208] = cVar33 + '\x05';
          }
          auVar42 = auVar57 ^ auVar26;
          auVar64._0_4_ = -(uint)(iVar37 < auVar42._0_4_);
          auVar64._4_4_ = -(uint)(iVar51 < auVar42._4_4_);
          auVar64._8_4_ = -(uint)(iVar72 < auVar42._8_4_);
          auVar64._12_4_ = -(uint)(iVar73 < auVar42._12_4_);
          auVar80._4_4_ = auVar64._0_4_;
          auVar80._0_4_ = auVar64._0_4_;
          auVar80._8_4_ = auVar64._8_4_;
          auVar80._12_4_ = auVar64._8_4_;
          iVar87 = -(uint)(auVar42._4_4_ == iVar51);
          iVar91 = -(uint)(auVar42._12_4_ == iVar73);
          auVar17._4_4_ = iVar87;
          auVar17._0_4_ = iVar87;
          auVar17._8_4_ = iVar91;
          auVar17._12_4_ = iVar91;
          auVar89._4_4_ = auVar64._4_4_;
          auVar89._0_4_ = auVar64._4_4_;
          auVar89._8_4_ = auVar64._12_4_;
          auVar89._12_4_ = auVar64._12_4_;
          auVar42 = auVar17 & auVar80 | auVar89;
          auVar42 = packssdw(auVar42,auVar42);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar42 = packssdw(auVar42 ^ auVar7,auVar42 ^ auVar7);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pIVar29[0x270] = cVar33 + '\x06';
          }
          auVar42 = pshufhw(auVar42,auVar80,0x84);
          auVar18._4_4_ = iVar87;
          auVar18._0_4_ = iVar87;
          auVar18._8_4_ = iVar91;
          auVar18._12_4_ = iVar91;
          auVar74 = pshufhw(auVar64,auVar18,0x84);
          auVar70 = pshufhw(auVar42,auVar89,0x84);
          auVar45._8_4_ = 0xffffffff;
          auVar45._0_8_ = 0xffffffffffffffff;
          auVar45._12_4_ = 0xffffffff;
          auVar45 = (auVar70 | auVar74 & auVar42) ^ auVar45;
          auVar42 = packssdw(auVar45,auVar45);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42._6_2_ >> 8 & 1) != 0) {
            pIVar29[0x2d8] = cVar33 + '\a';
          }
          auVar42 = auVar56 ^ auVar26;
          auVar65._0_4_ = -(uint)(iVar37 < auVar42._0_4_);
          auVar65._4_4_ = -(uint)(iVar51 < auVar42._4_4_);
          auVar65._8_4_ = -(uint)(iVar72 < auVar42._8_4_);
          auVar65._12_4_ = -(uint)(iVar73 < auVar42._12_4_);
          auVar19._4_4_ = auVar65._0_4_;
          auVar19._0_4_ = auVar65._0_4_;
          auVar19._8_4_ = auVar65._8_4_;
          auVar19._12_4_ = auVar65._8_4_;
          auVar74 = pshuflw(auVar89,auVar19,0xe8);
          auVar46._0_4_ = -(uint)(auVar42._0_4_ == iVar37);
          auVar46._4_4_ = -(uint)(auVar42._4_4_ == iVar51);
          auVar46._8_4_ = -(uint)(auVar42._8_4_ == iVar72);
          auVar46._12_4_ = -(uint)(auVar42._12_4_ == iVar73);
          auVar81._4_4_ = auVar46._4_4_;
          auVar81._0_4_ = auVar46._4_4_;
          auVar81._8_4_ = auVar46._12_4_;
          auVar81._12_4_ = auVar46._12_4_;
          auVar42 = pshuflw(auVar46,auVar81,0xe8);
          auVar82._4_4_ = auVar65._4_4_;
          auVar82._0_4_ = auVar65._4_4_;
          auVar82._8_4_ = auVar65._12_4_;
          auVar82._12_4_ = auVar65._12_4_;
          auVar70 = pshuflw(auVar65,auVar82,0xe8);
          auVar66._8_4_ = 0xffffffff;
          auVar66._0_8_ = 0xffffffffffffffff;
          auVar66._12_4_ = 0xffffffff;
          auVar66 = (auVar70 | auVar42 & auVar74) ^ auVar66;
          auVar70 = packssdw(auVar66,auVar66);
          auVar42 = packsswb(auVar42 & auVar74,auVar70);
          if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pIVar29[0x340] = cVar33 + '\b';
          }
          auVar20._4_4_ = auVar65._0_4_;
          auVar20._0_4_ = auVar65._0_4_;
          auVar20._8_4_ = auVar65._8_4_;
          auVar20._12_4_ = auVar65._8_4_;
          auVar82 = auVar81 & auVar20 | auVar82;
          auVar70 = packssdw(auVar82,auVar82);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70 ^ auVar8,auVar70 ^ auVar8);
          auVar42 = packsswb(auVar42,auVar70);
          if ((auVar42._8_2_ >> 8 & 1) != 0) {
            pIVar29[0x3a8] = cVar33 + '\t';
          }
          auVar42 = auVar55 ^ auVar26;
          auVar67._0_4_ = -(uint)(iVar37 < auVar42._0_4_);
          auVar67._4_4_ = -(uint)(iVar51 < auVar42._4_4_);
          auVar67._8_4_ = -(uint)(iVar72 < auVar42._8_4_);
          auVar67._12_4_ = -(uint)(iVar73 < auVar42._12_4_);
          auVar83._4_4_ = auVar67._0_4_;
          auVar83._0_4_ = auVar67._0_4_;
          auVar83._8_4_ = auVar67._8_4_;
          auVar83._12_4_ = auVar67._8_4_;
          iVar87 = -(uint)(auVar42._4_4_ == iVar51);
          iVar91 = -(uint)(auVar42._12_4_ == iVar73);
          auVar21._4_4_ = iVar87;
          auVar21._0_4_ = iVar87;
          auVar21._8_4_ = iVar91;
          auVar21._12_4_ = iVar91;
          auVar90._4_4_ = auVar67._4_4_;
          auVar90._0_4_ = auVar67._4_4_;
          auVar90._8_4_ = auVar67._12_4_;
          auVar90._12_4_ = auVar67._12_4_;
          auVar42 = auVar21 & auVar83 | auVar90;
          auVar42 = packssdw(auVar42,auVar42);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar42 = packssdw(auVar42 ^ auVar9,auVar42 ^ auVar9);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            pIVar29[0x410] = cVar33 + '\n';
          }
          auVar42 = pshufhw(auVar42,auVar83,0x84);
          auVar22._4_4_ = iVar87;
          auVar22._0_4_ = iVar87;
          auVar22._8_4_ = iVar91;
          auVar22._12_4_ = iVar91;
          auVar74 = pshufhw(auVar67,auVar22,0x84);
          auVar70 = pshufhw(auVar42,auVar90,0x84);
          auVar47._8_4_ = 0xffffffff;
          auVar47._0_8_ = 0xffffffffffffffff;
          auVar47._12_4_ = 0xffffffff;
          auVar47 = (auVar70 | auVar74 & auVar42) ^ auVar47;
          auVar42 = packssdw(auVar47,auVar47);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42._10_2_ >> 8 & 1) != 0) {
            pIVar29[0x478] = cVar33 + '\v';
          }
          auVar42 = auVar54 ^ auVar26;
          auVar68._0_4_ = -(uint)(iVar37 < auVar42._0_4_);
          auVar68._4_4_ = -(uint)(iVar51 < auVar42._4_4_);
          auVar68._8_4_ = -(uint)(iVar72 < auVar42._8_4_);
          auVar68._12_4_ = -(uint)(iVar73 < auVar42._12_4_);
          auVar23._4_4_ = auVar68._0_4_;
          auVar23._0_4_ = auVar68._0_4_;
          auVar23._8_4_ = auVar68._8_4_;
          auVar23._12_4_ = auVar68._8_4_;
          auVar74 = pshuflw(auVar90,auVar23,0xe8);
          auVar48._0_4_ = -(uint)(auVar42._0_4_ == iVar37);
          auVar48._4_4_ = -(uint)(auVar42._4_4_ == iVar51);
          auVar48._8_4_ = -(uint)(auVar42._8_4_ == iVar72);
          auVar48._12_4_ = -(uint)(auVar42._12_4_ == iVar73);
          auVar84._4_4_ = auVar48._4_4_;
          auVar84._0_4_ = auVar48._4_4_;
          auVar84._8_4_ = auVar48._12_4_;
          auVar84._12_4_ = auVar48._12_4_;
          auVar42 = pshuflw(auVar48,auVar84,0xe8);
          auVar85._4_4_ = auVar68._4_4_;
          auVar85._0_4_ = auVar68._4_4_;
          auVar85._8_4_ = auVar68._12_4_;
          auVar85._12_4_ = auVar68._12_4_;
          auVar70 = pshuflw(auVar68,auVar85,0xe8);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar42 = packssdw(auVar42 & auVar74,(auVar70 | auVar42 & auVar74) ^ auVar10);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pIVar29[0x4e0] = cVar33 + '\f';
          }
          auVar24._4_4_ = auVar68._0_4_;
          auVar24._0_4_ = auVar68._0_4_;
          auVar24._8_4_ = auVar68._8_4_;
          auVar24._12_4_ = auVar68._8_4_;
          auVar85 = auVar84 & auVar24 | auVar85;
          auVar70 = packssdw(auVar85,auVar85);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar42 = packssdw(auVar42,auVar70 ^ auVar11);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42._12_2_ >> 8 & 1) != 0) {
            pIVar29[0x548] = cVar33 + '\r';
          }
          auVar42 = auVar52 ^ auVar26;
          auVar69._0_4_ = -(uint)(iVar37 < auVar42._0_4_);
          auVar69._4_4_ = -(uint)(iVar51 < auVar42._4_4_);
          auVar69._8_4_ = -(uint)(iVar72 < auVar42._8_4_);
          auVar69._12_4_ = -(uint)(iVar73 < auVar42._12_4_);
          auVar86._4_4_ = auVar69._0_4_;
          auVar86._0_4_ = auVar69._0_4_;
          auVar86._8_4_ = auVar69._8_4_;
          auVar86._12_4_ = auVar69._8_4_;
          iVar37 = -(uint)(auVar42._4_4_ == iVar51);
          iVar51 = -(uint)(auVar42._12_4_ == iVar73);
          auVar71._4_4_ = iVar37;
          auVar71._0_4_ = iVar37;
          auVar71._8_4_ = iVar51;
          auVar71._12_4_ = iVar51;
          auVar49._4_4_ = auVar69._4_4_;
          auVar49._0_4_ = auVar69._4_4_;
          auVar49._8_4_ = auVar69._12_4_;
          auVar49._12_4_ = auVar69._12_4_;
          auVar49 = auVar71 & auVar86 | auVar49;
          auVar42 = packssdw(auVar49,auVar49);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar42 = packssdw(auVar42 ^ auVar12,auVar42 ^ auVar12);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pIVar29[0x5b0] = cVar33 + '\x0e';
          }
          auVar42 = pshufhw(auVar42,auVar86,0x84);
          auVar70 = pshufhw(auVar69,auVar71,0x84);
          in_XMM11 = auVar70 & auVar42;
          auVar25._4_4_ = auVar69._4_4_;
          auVar25._0_4_ = auVar69._4_4_;
          auVar25._8_4_ = auVar69._12_4_;
          auVar25._12_4_ = auVar69._12_4_;
          auVar42 = pshufhw(auVar42,auVar25,0x84);
          auVar50._8_4_ = 0xffffffff;
          auVar50._0_8_ = 0xffffffffffffffff;
          auVar50._12_4_ = 0xffffffff;
          auVar50 = (auVar42 | in_XMM11) ^ auVar50;
          auVar42 = packssdw(auVar50,auVar50);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42._14_2_ >> 8 & 1) != 0) {
            pIVar29[0x618] = cVar33 + '\x0f';
          }
          uVar31 = uVar31 + 0x10;
          lVar34 = (long)DAT_00184290;
          lVar53 = auVar60._8_8_;
          auVar60._0_8_ = auVar60._0_8_ + lVar34;
          lVar32 = DAT_00184290._8_8_;
          auVar60._8_8_ = lVar53 + lVar32;
          lVar53 = auVar59._8_8_;
          auVar59._0_8_ = auVar59._0_8_ + lVar34;
          auVar59._8_8_ = lVar53 + lVar32;
          lVar53 = auVar58._8_8_;
          auVar58._0_8_ = auVar58._0_8_ + lVar34;
          auVar58._8_8_ = lVar53 + lVar32;
          lVar53 = auVar57._8_8_;
          auVar57._0_8_ = auVar57._0_8_ + lVar34;
          auVar57._8_8_ = lVar53 + lVar32;
          lVar53 = auVar56._8_8_;
          auVar56._0_8_ = auVar56._0_8_ + lVar34;
          auVar56._8_8_ = lVar53 + lVar32;
          lVar53 = auVar55._8_8_;
          auVar55._0_8_ = auVar55._0_8_ + lVar34;
          auVar55._8_8_ = lVar53 + lVar32;
          lVar53 = auVar54._8_8_;
          auVar54._0_8_ = auVar54._0_8_ + lVar34;
          auVar54._8_8_ = lVar53 + lVar32;
          lVar53 = auVar52._8_8_;
          auVar52._0_8_ = auVar52._0_8_ + lVar34;
          auVar52._8_8_ = lVar53 + lVar32;
          pIVar29 = pIVar29 + 0x680;
          auVar42 = _DAT_00184290;
        } while ((uVar39 + 0xf & 0xfffffff0) != uVar31);
      }
      lVar34 = 0x52;
      lVar32 = 0;
      do {
        (table->DisplayOrderToIndex).Data[*(char *)((long)&((table->Columns).Data)->Flags + lVar34)]
             = (char)lVar32;
        lVar32 = lVar32 + 1;
        lVar34 = lVar34 + 0x68;
      } while (lVar32 < table->ColumnsCount);
    }
  }
  return;
}

Assistant:

void ImGui::TableLoadSettings(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    table->IsSettingsRequestLoad = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind settings
    ImGuiTableSettings* settings;
    if (table->SettingsOffset == -1)
    {
        settings = TableSettingsFindByID(table->ID);
        if (settings == NULL)
            return;
        if (settings->ColumnsCount != table->ColumnsCount) // Allow settings if columns count changed. We could otherwise decide to return...
            table->IsSettingsDirty = true;
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    else
    {
        settings = TableGetBoundSettings(table);
    }

    table->SettingsLoadedFlags = settings->SaveFlags;
    table->RefScale = settings->RefScale;

    // Serialize ImGuiTableSettings/ImGuiTableColumnSettings into ImGuiTable/ImGuiTableColumn
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();
    ImU64 display_order_mask = 0;
    for (int data_n = 0; data_n < settings->ColumnsCount; data_n++, column_settings++)
    {
        int column_n = column_settings->Index;
        if (column_n < 0 || column_n >= table->ColumnsCount)
            continue;

        ImGuiTableColumn* column = &table->Columns[column_n];
        if (settings->SaveFlags & ImGuiTableFlags_Resizable)
        {
            if (column_settings->IsStretch)
                column->StretchWeight = column_settings->WidthOrWeight;
            else
                column->WidthRequest = column_settings->WidthOrWeight;
            column->AutoFitQueue = 0x00;
        }
        if (settings->SaveFlags & ImGuiTableFlags_Reorderable)
            column->DisplayOrder = column_settings->DisplayOrder;
        else
            column->DisplayOrder = (ImGuiTableColumnIdx)column_n;
        display_order_mask |= (ImU64)1 << column->DisplayOrder;
        column->IsUserEnabled = column->IsUserEnabledNextFrame = column_settings->IsEnabled;
        column->SortOrder = column_settings->SortOrder;
        column->SortDirection = column_settings->SortDirection;
    }

    // Validate and fix invalid display order data
    const ImU64 expected_display_order_mask = (settings->ColumnsCount == 64) ? ~0 : ((ImU64)1 << settings->ColumnsCount) - 1;
    if (display_order_mask != expected_display_order_mask)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
            table->Columns[column_n].DisplayOrder = (ImGuiTableColumnIdx)column_n;

    // Rebuild index
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
}